

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

int __thiscall leveldb::RecoveryTest::NumLogs(RecoveryTest *this)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  GetFiles((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_28,this,kLogFile);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_28);
  return (int)((ulong)((long)local_28._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_28._M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int NumLogs() { return GetFiles(kLogFile).size(); }